

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O0

int anon_unknown.dwarf_346899::lh_char_call_cmp_key(void *key,void *value)

{
  int iVar1;
  LHASH_CMP_KEY_char *cb;
  void *value_local;
  void *key_local;
  
  iVar1 = (**key)(*(undefined8 *)((long)key + 8),value);
  return iVar1;
}

Assistant:

static std::unique_ptr<char[]> RandString(void) {
  unsigned len = 1 + (rand() % 3);
  auto ret = std::make_unique<char[]>(len + 1);

  for (unsigned i = 0; i < len; i++) {
    ret[i] = '0' + (rand() & 7);
  }
  ret[len] = 0;

  return ret;
}